

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertCamera(FBXConverter *this,Camera *cam,string *orig_name)

{
  aiCamera *this_00;
  reference ppaVar1;
  float fVar2;
  float fVar3;
  aiVector3t<float> local_54;
  aiVector3t<float> local_48;
  aiVector3t<float> local_3c;
  value_type local_30;
  aiCamera *out_camera;
  string *local_20;
  string *orig_name_local;
  Camera *cam_local;
  FBXConverter *this_local;
  
  local_20 = orig_name;
  orig_name_local = (string *)cam;
  cam_local = (Camera *)this;
  this_00 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(this_00);
  out_camera = this_00;
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back(&this->cameras,&out_camera);
  ppaVar1 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::back(&this->cameras);
  local_30 = *ppaVar1;
  aiString::Set(&local_30->mName,local_20);
  fVar2 = Camera::AspectWidth((Camera *)orig_name_local);
  fVar3 = Camera::AspectHeight((Camera *)orig_name_local);
  local_30->mAspect = fVar2 / fVar3;
  aiVector3t<float>::aiVector3t(&local_3c,0.0);
  (local_30->mPosition).x = local_3c.x;
  (local_30->mPosition).y = local_3c.y;
  (local_30->mPosition).z = local_3c.z;
  aiVector3t<float>::aiVector3t(&local_48,1.0,0.0,0.0);
  (local_30->mLookAt).x = local_48.x;
  (local_30->mLookAt).y = local_48.y;
  (local_30->mLookAt).z = local_48.z;
  aiVector3t<float>::aiVector3t(&local_54,0.0,1.0,0.0);
  (local_30->mUp).x = local_54.x;
  (local_30->mUp).y = local_54.y;
  (local_30->mUp).z = local_54.z;
  fVar2 = Camera::FieldOfView((Camera *)orig_name_local);
  local_30->mHorizontalFOV = fVar2 * 0.017453292;
  fVar2 = Camera::NearPlane((Camera *)orig_name_local);
  local_30->mClipPlaneNear = fVar2;
  fVar2 = Camera::FarPlane((Camera *)orig_name_local);
  local_30->mClipPlaneFar = fVar2;
  fVar2 = Camera::FieldOfView((Camera *)orig_name_local);
  local_30->mHorizontalFOV = fVar2 * 0.017453292;
  fVar2 = Camera::NearPlane((Camera *)orig_name_local);
  local_30->mClipPlaneNear = fVar2;
  fVar2 = Camera::FarPlane((Camera *)orig_name_local);
  local_30->mClipPlaneFar = fVar2;
  return;
}

Assistant:

void FBXConverter::ConvertCamera(const Camera& cam, const std::string &orig_name)
        {
            cameras.push_back(new aiCamera());
            aiCamera* const out_camera = cameras.back();

            out_camera->mName.Set(orig_name);

            out_camera->mAspect = cam.AspectWidth() / cam.AspectHeight();

            out_camera->mPosition = aiVector3D(0.0f);
            out_camera->mLookAt = aiVector3D(1.0f, 0.0f, 0.0f);
            out_camera->mUp = aiVector3D(0.0f, 1.0f, 0.0f);

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());

            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());
            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();
        }